

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_compare.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  
  pcVar4 = *argv;
  uVar3 = 0;
  do {
    iVar1 = getopt(argc,argv,"pahv");
    if (iVar1 < 0x68) {
      if (iVar1 != 0x61) {
        if (iVar1 != -1) {
          if (iVar1 == 0x3f) goto LAB_001014ba;
          goto LAB_001014cd;
        }
        lVar5 = (long)_optind;
        if (argc - _optind != 3) {
          if (argc - _optind == 2) {
            iVar1 = version_compare4(argv[lVar5],argv[lVar5 + 1],uVar3,uVar3);
            if (iVar1 < 0) {
              pcVar4 = "<";
            }
            else if (iVar1 == 0) {
              pcVar4 = "=";
            }
            else {
              pcVar4 = ">";
            }
            puts(pcVar4);
            return 0;
          }
          goto LAB_001014cd;
        }
        uVar3 = version_compare4(argv[lVar5],argv[lVar5 + 2],uVar3,uVar3);
        __s1 = argv[lVar5 + 1];
        iVar1 = strcmp(__s1,"<");
        if ((iVar1 == 0) || (iVar1 = strcmp(__s1,"lt"), iVar1 == 0)) {
          uVar3 = ~uVar3;
        }
        else {
          iVar1 = strcmp(__s1,"<=");
          if (((iVar1 == 0) || (iVar1 = strcmp(__s1,"=<"), iVar1 == 0)) ||
             (iVar1 = strcmp(__s1,"le"), iVar1 == 0)) {
            return (uint)(0 < (int)uVar3);
          }
          iVar1 = strcmp(__s1,"=");
          if ((iVar1 == 0) || (iVar1 = strcmp(__s1,"eq"), iVar1 == 0)) {
            return (uint)(uVar3 != 0);
          }
          iVar1 = strcmp(__s1,">=");
          if (((iVar1 != 0) && (iVar1 = strcmp(__s1,"=>"), iVar1 != 0)) &&
             (iVar1 = strcmp(__s1,"ge"), iVar1 != 0)) {
            iVar1 = strcmp(__s1,">");
            if ((iVar1 == 0) || (iVar1 = strcmp(__s1,"gt"), iVar1 == 0)) {
              return (uint)((int)uVar3 < 1);
            }
            goto LAB_001014cd;
          }
        }
        return uVar3 >> 0x1f;
      }
      uVar2 = 2;
    }
    else {
      uVar2 = 1;
      if (iVar1 != 0x70) {
        if (iVar1 == 0x68) {
LAB_001014ba:
          print_usage(pcVar4);
        }
        else {
          if (iVar1 != 0x76) {
LAB_001014cd:
            print_usage(pcVar4);
            return 1;
          }
          main_cold_1();
        }
        return 0;
      }
    }
    uVar3 = uVar3 | uVar2;
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
	int ch, result, flags = 0;
	const char* progname = argv[0];

	while ((ch = getopt(argc, argv, "pahv")) != -1) {
		switch (ch) {
		case 'p':
			flags |= VERSIONFLAG_P_IS_PATCH;
			break;
		case 'a':
			flags |= VERSIONFLAG_ANY_IS_PATCH;
			break;
		case 'h':
		case '?':
			print_usage(progname);
			return 0;
		case 'v':
			print_version();
			return 0;
		default:
			print_usage(progname);
			return 1;
		}
	}

	argc -= optind;
	argv += optind;

	if (argc == 2) {
		result = version_compare4(argv[0], argv[1], flags, flags);

		if (result < 0)
			printf("<\n");
		else if (result > 0)
			printf(">\n");
		else
			printf("=\n");

		return 0;
	} else if (argc == 3) {
		result = version_compare4(argv[0], argv[2], flags, flags);

		if (streq(argv[1], "<") || streq(argv[1], "lt"))
			return !(result < 0);
		else if (streq(argv[1], "<=") || streq(argv[1], "=<") || streq(argv[1], "le"))
			return !(result <= 0);
		else if (streq(argv[1], "=") || streq(argv[1], "=") || streq(argv[1], "eq"))
			return !(result == 0);
		else if (streq(argv[1], ">=") || streq(argv[1], "=>") || streq(argv[1], "ge"))
			return !(result >= 0);
		else if (streq(argv[1], ">") || streq(argv[1], "gt"))
			return !(result > 0);
	}

	print_usage(progname);
	return 1;
}